

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitYieldAndResume(RegSlot resumeValueReg,RegSlot inputReg,ByteCodeLabel resumeNormalLabel,
                       ByteCodeLabel resumeThrowLabel,ByteCodeGenerator *byteCodeGenerator,
                       FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  RegSlot RVar1;
  Type piVar2;
  Type pSVar3;
  code *pcVar4;
  bool bVar5;
  RegSlot value;
  uint uVar6;
  hash_t hVar7;
  RegSlot *pRVar8;
  undefined4 *puVar9;
  DictionaryStats *pDVar10;
  uint uVar11;
  uint depth;
  
  this = &byteCodeGenerator->m_writer;
  Js::ByteCodeWriter::SetCurrentLoopHasYield(this);
  if (funcInfo->yieldRegister != inputReg) {
    Js::ByteCodeWriter::Reg2(this,Ld_A,funcInfo->yieldRegister,inputReg);
  }
  ByteCodeGenerator::EmitLeaveOpCodesBeforeYield(byteCodeGenerator);
  Js::ByteCodeWriter::Reg2(this,Yield,funcInfo->yieldRegister,funcInfo->yieldRegister);
  ByteCodeGenerator::EmitTryBlockHeadersAfterYield(byteCodeGenerator);
  value = FuncInfo::AcquireTmpRegister(funcInfo);
  RVar1 = funcInfo->yieldRegister;
  depth = 0;
  uVar6 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar1,0xe7,false,false);
  Js::ByteCodeWriter::PatchableProperty(this,LdFld,value,RVar1,uVar6,false,false);
  RVar1 = funcInfo->yieldRegister;
  uVar6 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar1,0x197,false,false);
  Js::ByteCodeWriter::PatchableProperty(this,LdFld,resumeValueReg,RVar1,uVar6,false,false);
  piVar2 = (funcInfo->constantToRegister).buckets;
  if (piVar2 != (Type)0x0) {
    depth = 0;
    hVar7 = PrimePolicy::ModPrime
                      (0,(funcInfo->constantToRegister).bucketCount,
                       (funcInfo->constantToRegister).modFunctionIndex);
    uVar11 = piVar2[hVar7];
    if (-1 < (int)uVar11) {
      pSVar3 = (funcInfo->constantToRegister).entries;
      depth = 0;
      do {
        if (pSVar3[uVar11].
            super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_int,_unsigned_int>.
            super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
            .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.key == 0) {
          pDVar10 = (funcInfo->constantToRegister).stats;
          goto LAB_00823654;
        }
        depth = depth + 1;
        uVar11 = pSVar3[uVar11].
                 super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                 super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                 .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.next;
      } while (-1 < (int)uVar11);
    }
  }
  pDVar10 = (funcInfo->constantToRegister).stats;
  uVar11 = 0xffffffff;
LAB_00823654:
  if (pDVar10 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(pDVar10,depth);
  }
  if ((int)uVar11 < 0) {
    pRVar8 = &Js::Constants::NoRegister;
  }
  else {
    pRVar8 = (RegSlot *)((funcInfo->constantToRegister).entries + uVar11);
  }
  RVar1 = (((Type)pRVar8)->
          super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          ).super_KeyValueEntry<unsigned_int,_unsigned_int>.
          super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
          .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.value;
  if (RVar1 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2911,"(normalConst != Js::Constants::NoRegister)",
                       "normalConst != Js::Constants::NoRegister");
    if (!bVar5) goto LAB_00823844;
    *puVar9 = 0;
  }
  Js::ByteCodeWriter::BrReg2(this,BrSrEq_A,resumeNormalLabel,value,RVar1);
  if (resumeThrowLabel != -1) {
    piVar2 = (funcInfo->constantToRegister).buckets;
    uVar6 = 0;
    if (piVar2 != (Type)0x0) {
      hVar7 = PrimePolicy::ModPrime
                        (1,(funcInfo->constantToRegister).bucketCount,
                         (funcInfo->constantToRegister).modFunctionIndex);
      uVar11 = piVar2[hVar7];
      if (-1 < (int)uVar11) {
        pSVar3 = (funcInfo->constantToRegister).entries;
        uVar6 = 0;
        do {
          if (pSVar3[uVar11].
              super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<unsigned_int,_unsigned_int>.
              super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
              .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.key == 1) {
            pDVar10 = (funcInfo->constantToRegister).stats;
            goto LAB_00823771;
          }
          uVar6 = uVar6 + 1;
          uVar11 = pSVar3[uVar11].
                   super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                   super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                   .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.next;
        } while (-1 < (int)uVar11);
      }
    }
    pDVar10 = (funcInfo->constantToRegister).stats;
    uVar11 = 0xffffffff;
LAB_00823771:
    if (pDVar10 != (DictionaryStats *)0x0) {
      DictionaryStats::Lookup(pDVar10,uVar6);
    }
    if ((int)uVar11 < 0) {
      pRVar8 = &Js::Constants::NoRegister;
    }
    else {
      pRVar8 = (RegSlot *)((funcInfo->constantToRegister).entries + uVar11);
    }
    RVar1 = (((Type)pRVar8)->
            super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            ).super_KeyValueEntry<unsigned_int,_unsigned_int>.
            super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
            .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.value;
    if (RVar1 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x291c,"(throwConst != Js::Constants::NoRegister)",
                         "throwConst != Js::Constants::NoRegister");
      if (!bVar5) {
LAB_00823844:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    Js::ByteCodeWriter::BrReg2(this,BrSrEq_A,resumeThrowLabel,value,RVar1);
  }
  FuncInfo::ReleaseTmpRegister(funcInfo,value);
  return;
}

Assistant:

void EmitYieldAndResume(
    Js::RegSlot resumeValueReg,
    Js::RegSlot inputReg,
    Js::ByteCodeLabel resumeNormalLabel,
    Js::ByteCodeLabel resumeThrowLabel,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    // If `resultThrowLabel` is a valid label, then the instruction
    // sequence following this call must handle the return yield resume
    // case. Otherwise, the instruction sequence following this call
    // must handle both the throw and return cases.

    auto* writer = byteCodeGenerator->Writer();

    // If in a loop mark it as containing Yield and hence not eligible for Jit loop body
    writer->SetCurrentLoopHasYield();

    if (inputReg != funcInfo->yieldRegister)
        writer->Reg2(Js::OpCode::Ld_A, funcInfo->yieldRegister, inputReg);

    // Yield the result. On resume, the resume yield object will be in yieldRegister
    byteCodeGenerator->EmitLeaveOpCodesBeforeYield();
    writer->Reg2(Js::OpCode::Yield, funcInfo->yieldRegister, funcInfo->yieldRegister);
    byteCodeGenerator->EmitTryBlockHeadersAfterYield();

    Js::RegSlot resumeKindReg = funcInfo->AcquireTmpRegister();

    // Get the "kind" property of the resume object
    EmitGetObjectProperty(
        resumeKindReg,
        funcInfo->yieldRegister,
        Js::PropertyIds::kind,
        byteCodeGenerator,
        funcInfo);

    // Get the "value" property of the resume object
    EmitGetObjectProperty(
        resumeValueReg,
        funcInfo->yieldRegister,
        Js::PropertyIds::value,
        byteCodeGenerator,
        funcInfo);

    Js::RegSlot normalConst = funcInfo->constantToRegister.Lookup(
        (uint)Js::ResumeYieldKind::Normal,
        Js::Constants::NoRegister);

    Assert(normalConst != Js::Constants::NoRegister);

    // Branch to normal resume if kind is Normal
    writer->BrReg2(Js::OpCode::BrSrEq_A, resumeNormalLabel, resumeKindReg, normalConst);

    if (resumeThrowLabel != Js::Constants::NoByteCodeLabel)
    {
        Js::RegSlot throwConst = funcInfo->constantToRegister.Lookup(
            (uint)Js::ResumeYieldKind::Throw,
            Js::Constants::NoRegister);

        Assert(throwConst != Js::Constants::NoRegister);

        // Branch to throw if kind is Throw
        writer->BrReg2(Js::OpCode::BrSrEq_A, resumeThrowLabel, resumeKindReg, throwConst);
    }

    funcInfo->ReleaseTmpRegister(resumeKindReg);
}